

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O1

nsync_time nsync_time_sleep(nsync_time delay)

{
  nsync_time nVar1;
  int iVar2;
  timespec remain;
  timespec ts;
  timespec local_28;
  timespec local_18;
  
  local_18.tv_nsec = delay.tv_nsec;
  local_18.tv_sec = delay.tv_sec;
  iVar2 = nanosleep(&local_18,&local_28);
  if (iVar2 == 0) {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 0;
  }
  nVar1.tv_nsec = local_28.tv_nsec;
  nVar1.tv_sec = local_28.tv_sec;
  return nVar1;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	struct timespec ts;
	struct timespec remain;
	memset (&ts, 0, sizeof (ts));
	ts.tv_sec = NSYNC_TIME_SEC (delay);
	ts.tv_nsec = NSYNC_TIME_NSEC (delay);
	if (nanosleep (&ts, &remain) == 0) {
		/* nanosleep() is not required to fill in "remain"
		   if it returns 0. */
		memset (&remain, 0, sizeof (remain));
	}
	return (remain);
}